

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstDumper.cc
# Opt level: O0

int __thiscall mcc::AstDumper::Visit(AstDumper *this,Label *label)

{
  int iVar1;
  ostream *poVar2;
  element_type *this_00;
  string *psVar3;
  allocator<char> local_39;
  string local_38 [32];
  Label *local_18;
  Label *label_local;
  AstDumper *this_local;
  
  this->spaces_ = this->spaces_ + 2;
  poVar2 = this->out_;
  iVar1 = this->spaces_;
  local_18 = label;
  label_local = (Label *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,(long)iVar1,' ',&local_39);
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"<label>");
  this_00 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       &(local_18->super_Stmt).token_);
  psVar3 = Token::String_abi_cxx11_(this_00);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,"</label>\n");
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  this->spaces_ = this->spaces_ + -2;
  return 0;
}

Assistant:

int AstDumper::Visit(Label &label) {
  spaces_ += TAB_SIZE;
  out_ << std::string(spaces_, ' ') << "<label>"
       << label.token_->String() << "</label>\n";
  spaces_ -= TAB_SIZE;
  return 0;
}